

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O1

void __thiscall Sampling_PermutationElement_Test::TestBody(Sampling_PermutationElement_Test *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  char *in_R9;
  ulong uVar6;
  uint32_t w;
  ulong uVar7;
  size_type __n;
  AssertionResult gtest_ar_;
  vector<bool,_std::allocator<bool>_> seen;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  allocator_type local_a0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  ulong local_90;
  AssertHelper local_88;
  string local_80;
  vector<bool,_std::allocator<bool>_> local_60;
  ulong local_38;
  
  __n = 2;
  do {
    uVar2 = (int)__n - 1;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    uVar2 = uVar2 >> 0x10 | uVar2;
    uVar5 = 0;
    do {
      local_80._M_dataplus._M_p._0_1_ = 0;
      std::vector<bool,_std::allocator<bool>_>::vector(&local_60,__n,(bool *)&local_80,local_a0);
      uVar6 = 0;
      do {
        uVar4 = uVar6;
        do {
          uVar3 = ((uint)uVar4 ^ uVar5) * -0x1e8f76c3;
          uVar3 = ((uVar3 & uVar2) >> 4 ^ uVar3) * 0x929eb3f;
          uVar3 = ((uVar3 & uVar2) >> 1 ^ uVar3) * 0x6935fa69;
          uVar3 = ((uVar3 & uVar2) >> 0xb ^ uVar3) * 0x74dcb303;
          uVar3 = ((uVar3 & uVar2) >> 2 ^ uVar3) * -0x61afe33d;
          uVar3 = ((uVar3 & uVar2) >> 2 ^ uVar3) * -0x379f5c21 & uVar2;
          uVar3 = uVar3 >> 5 ^ uVar3;
          uVar4 = (ulong)uVar3;
        } while (__n <= uVar4);
        local_90 = (ulong)(uVar3 + uVar5) % (__n & 0xffffffff);
        local_38 = (ulong)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                   ((long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                   (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
        local_a0[0] = (allocator_type)(local_90 < local_38);
        local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_90 < local_38) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          uVar4 = local_90;
        }
        else {
          testing::Message::Message((Message *)&local_a8);
          std::ostream::operator<<((ostream *)(local_a8.ptr_ + 0x10),(int)local_90);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)local_a0,
                     (AssertionResult *)"offset >= 0 && offset < seen.size()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x3e1,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_));
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
          uVar4 = local_90;
          if (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_a8.ptr_ + 8))();
            }
            local_a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 );
          if (local_38 <= uVar4) goto LAB_0031a474;
        }
        uVar7 = uVar4 >> 6 & 0x3ffffff;
        local_a0[0] = (allocator_type)
                      ((local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar7] >>
                        (uVar4 & 0x3f) & 1) == 0);
        local_98.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_a0[0]) {
          testing::Message::Message((Message *)&local_a8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_80,(internal *)local_a0,(AssertionResult *)"seen[offset]","true","false"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_88,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/sampling_test.cpp"
                     ,0x3e2,(char *)CONCAT71(local_80._M_dataplus._M_p._1_7_,
                                             local_80._M_dataplus._M_p._0_1_));
          testing::internal::AssertHelper::operator=(&local_88,(Message *)&local_a8);
          testing::internal::AssertHelper::~AssertHelper(&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_) !=
              &local_80.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_80._M_dataplus._M_p._1_7_,local_80._M_dataplus._M_p._0_1_
                                    ),local_80.field_2._M_allocated_capacity + 1);
          }
          if (local_a8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) &&
               (local_a8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_a8.ptr_ + 8))();
            }
            local_a8.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[uVar7] =
             local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar7] | 1L << (local_90 & 0x3f);
        if (local_38 <= local_90) {
LAB_0031a474:
          if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p == (_Bit_type *)0x0) {
            return;
          }
          operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
          return;
        }
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (__n != uVar6);
      if (local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                        (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_end_of_storage -
                        (long)local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_offset = 0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0;
        local_60.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage = (_Bit_pointer)0x0;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 10);
    __n = __n + 1;
    if (__n == 0x400) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Sampling, PermutationElement) {
    for (int len = 2; len < 1024; ++len) {
        for (int iter = 0; iter < 10; ++iter) {
            std::vector<bool> seen(len, false);

            for (int i = 0; i < len; ++i) {
                int offset = PermutationElement(i, len, iter);
                ASSERT_TRUE(offset >= 0 && offset < seen.size()) << offset;
                EXPECT_FALSE(seen[offset]);
                seen[offset] = true;
            }
        }
    }
}